

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O1

int run_loop(int fd,quicly_conn_t *client)

{
  unsigned_long *packet;
  _func_int64_t_st_quicly_now_t_ptr *p_Var1;
  uint8_t *datagram;
  quicly_sendbuf_t *sb;
  int iVar2;
  int iVar3;
  uint uVar4;
  int64_t iVar5;
  int64_t iVar6;
  int *piVar7;
  ulong datagram_size;
  size_t sVar8;
  quicly_stream_t *stream;
  ssize_t sVar9;
  ulong uVar10;
  quicly_conn_t **ppqVar11;
  undefined1 *puVar12;
  quicly_conn_t *pqVar13;
  undefined1 *puVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  undefined1 local_1a58 [8];
  uint8_t buf [4096];
  quicly_conn_t *conns [256];
  undefined1 local_250 [8];
  sockaddr_storage sa;
  quicly_decoded_packet_t decoded;
  fd_set readfds;
  undefined1 local_c0 [8];
  quicly_address_t src;
  size_t sStack_98;
  int local_90;
  undefined1 *local_88;
  undefined1 local_80 [8];
  timeval tv;
  size_t off;
  undefined1 *local_50;
  iovec vec;
  int local_38;
  
  puVar14 = local_1a58;
  memset(buf + 0xff8,0,0x800);
  vec.iov_len._4_4_ = (uint)(client != (quicly_conn_t *)0x0);
  iVar2 = fd + 0x3f;
  if (-1 < fd) {
    iVar2 = fd;
  }
  uVar10 = 1L << ((byte)fd & 0x3f);
  vec.iov_len._0_4_ = fd + 1;
  packet = &sa.__ss_align;
  buf._4088_8_ = client;
LAB_0011a202:
  do {
    p_Var1 = (ctx.now)->cb;
    *(undefined8 *)(puVar14 + -8) = 0x11a20b;
    iVar5 = (*p_Var1)(ctx.now);
    lVar15 = 0x7fffffffffffffff;
    if (buf._4088_8_ != 0) {
      ppqVar11 = conns;
      pqVar13 = (quicly_conn_t *)buf._4088_8_;
      do {
        *(undefined8 *)(puVar14 + -8) = 0x11a230;
        iVar6 = quicly_get_first_timeout(pqVar13);
        if (iVar6 < lVar15) {
          lVar15 = iVar6;
        }
        pqVar13 = *ppqVar11;
        ppqVar11 = ppqVar11 + 1;
      } while (pqVar13 != (quicly_conn_t *)0x0);
    }
    lVar16 = lVar15 - iVar5;
    if (lVar16 == 0 || lVar15 < iVar5) {
      local_80 = (undefined1  [8])0x3e8;
      tv.tv_sec = 0;
    }
    else {
      if (999999 < lVar16) {
        lVar16 = 1000000;
      }
      local_80 = (undefined1  [8])(lVar16 / 1000);
      tv.tv_sec = (lVar16 % 1000) * 1000;
    }
    decoded._is_stateless_reset_cached = QUICLY__DECODED_PACKET_CACHED_MAYBE_STATELESS_RESET;
    decoded._132_4_ = 0;
    readfds.fds_bits[(long)(iVar2 >> 6) + -1] = readfds.fds_bits[(long)(iVar2 >> 6) + -1] | uVar10;
    if (vec.iov_len._4_4_ != 0) {
      decoded._128_8_ = decoded._128_8_ | 1;
    }
    *(undefined8 *)(puVar14 + -8) = 0x11a30c;
    iVar3 = select((int)vec.iov_len,(fd_set *)&decoded._is_stateless_reset_cached,(fd_set *)0x0,
                   (fd_set *)0x0,(timeval *)local_80);
    if (iVar3 == -1) {
      *(undefined8 *)(puVar14 + -8) = 0x11a316;
      piVar7 = __errno_location();
      if (*piVar7 == 4) goto LAB_0011a202;
    }
    if ((readfds.fds_bits[(long)(iVar2 >> 6) + -1] & uVar10) != 0) {
      local_50 = local_1a58;
      vec.iov_base = (void *)0x1000;
      local_c0 = (undefined1  [8])local_250;
      src._0_4_ = 0x80;
      src.sin.sin_zero = (uchar  [8])&local_50;
      src._16_8_ = 1;
      stack0xffffffffffffff60 = (void *)0x0;
      sStack_98 = 0;
      local_90 = 0;
      do {
        *(undefined8 *)(puVar14 + -8) = 0x11a39b;
        datagram_size = recvmsg(fd,(msghdr *)local_c0,0);
        if (datagram_size != 0xffffffffffffffff) break;
        *(undefined8 *)(puVar14 + -8) = 0x11a3a9;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      if (0 < (long)datagram_size) {
        tv.tv_usec = 0;
        do {
          datagram = *(uint8_t **)src.sin.sin_zero;
          *(undefined8 *)(puVar14 + -8) = 0x11a3e2;
          sVar8 = quicly_decode_packet
                            (&ctx,(quicly_decoded_packet_t *)packet,datagram,datagram_size,
                             (size_t *)&tv.tv_usec);
          if (sVar8 == 0xffffffffffffffff) break;
          lVar15 = 0;
          pqVar13 = (quicly_conn_t *)buf._4088_8_;
          while (pqVar13 != (quicly_conn_t *)0x0) {
            *(undefined8 *)(puVar14 + -8) = 0x11a40b;
            iVar3 = quicly_is_destination
                              (pqVar13,(sockaddr *)0x0,(sockaddr *)local_c0,
                               (quicly_decoded_packet_t *)packet);
            if (iVar3 != 0) break;
            ppqVar11 = conns + lVar15;
            lVar15 = lVar15 + 1;
            pqVar13 = *ppqVar11;
          }
          pqVar13 = conns[lVar15 + -1];
          if (pqVar13 == (quicly_conn_t *)0x0) {
            if (client == (quicly_conn_t *)0x0) {
              *(undefined8 *)(puVar14 + -8) = 0;
              *(quicly_cid_plaintext_t **)(puVar14 + -0x10) = &next_cid;
              *(undefined8 *)(puVar14 + -0x18) = 0x11a46f;
              quicly_accept(conns + lVar15 + -1,&ctx,(sockaddr *)0x0,(sockaddr *)local_c0,
                            (quicly_decoded_packet_t *)packet,
                            (quicly_address_token_plaintext_t *)0x0,
                            *(quicly_cid_plaintext_t **)(puVar14 + -0x10),
                            *(ptls_handshake_properties_t **)(puVar14 + -8));
            }
          }
          else {
            *(undefined8 *)(puVar14 + -8) = 0x11a43a;
            quicly_receive(pqVar13,(sockaddr *)0x0,(sockaddr *)local_c0,
                           (quicly_decoded_packet_t *)packet);
          }
        } while ((ulong)tv.tv_usec < datagram_size);
      }
    }
    if ((decoded._128_8_ & 1) != 0) {
      if (client == (quicly_conn_t *)0x0) {
        *(code **)(puVar14 + -8) = quicly_streambuf_egress_shift;
        __assert_fail("client != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/examples/echo.c"
                      ,0xf3,"int run_loop(int, quicly_conn_t *)");
      }
      *(undefined8 *)(puVar14 + -8) = 0x11a49c;
      stream = quicly_get_stream(client,0);
      uVar4 = 0;
      if ((stream != (quicly_stream_t *)0x0) &&
         ((stream->sendstate).final_size == 0xffffffffffffffff)) {
        do {
          *(undefined8 *)(puVar14 + -8) = 0x11a4be;
          sVar8 = read(0,local_1a58,0x1000);
          if (sVar8 != 0xffffffffffffffff) break;
          *(undefined8 *)(puVar14 + -8) = 0x11a4cc;
          piVar7 = __errno_location();
        } while (*piVar7 == 4);
        if (sVar8 == 0) {
          *(undefined8 *)(puVar14 + -8) = 0x11a4fe;
          quicly_streambuf_egress_shutdown(stream);
          uVar4 = 0;
        }
        else {
          sb = (quicly_sendbuf_t *)stream->data;
          *(undefined8 *)(puVar14 + -8) = 0x11a4ef;
          quicly_sendbuf_write(stream,sb,local_1a58,sVar8);
          uVar4 = vec.iov_len._4_4_;
        }
      }
      vec.iov_len._4_4_ = uVar4;
    }
    bVar17 = buf._4088_8_ == 0;
    if (!bVar17) {
      ppqVar11 = (quicly_conn_t **)(buf + 0xff8);
      lVar15 = 0;
      local_88 = puVar14;
      do {
        puVar14 = local_88 +
                  -(ctx.transport_params.max_udp_payload_size * 10 + 0xf & 0xfffffffffffffff0);
        local_50 = (undefined1 *)0xa;
        pqVar13 = *ppqVar11;
        *(uint64_t *)(puVar14 + -0x10) = ctx.transport_params.max_udp_payload_size * 10;
        *(undefined8 *)(puVar14 + -0x18) = 0x11a573;
        uVar4 = quicly_send(pqVar13,(quicly_address_t *)local_250,(quicly_address_t *)local_c0,
                            (iovec *)local_1a58,(size_t *)&local_50,puVar14,
                            *(size_t *)(puVar14 + -0x10));
        if (uVar4 == 0xff03) {
          pqVar13 = *ppqVar11;
          *(undefined8 *)(puVar14 + -8) = 0x11a624;
          quicly_free(pqVar13);
          *(undefined8 *)(puVar14 + -8) = 0x11a64f;
          memmove(conns + lVar15 + -1,conns + lVar15,lVar15 * -8 + 0x7f8);
          lVar15 = lVar15 + -1;
          bVar18 = ((ctx.tls)->certificates).count != 0;
          if (!bVar18) {
            local_38 = 0;
          }
        }
        else if (uVar4 == 0) {
          bVar18 = true;
          if (local_50 != (undefined1 *)0x0) {
            puVar12 = (undefined1 *)0x0;
            do {
              sa.__ss_align = (unsigned_long)local_250;
              *(undefined8 *)(puVar14 + -8) = 0x11a5c2;
              decoded.octets.base._0_4_ = quicly_get_socklen((sockaddr *)sa.__ss_align);
              decoded.cid.dest.encrypted.base = (uint8_t *)0x1;
              decoded.cid.dest.encrypted.len = 0;
              decoded.cid.dest.plaintext.master_id = 0;
              decoded.cid.dest.plaintext._4_4_ = 0;
              decoded.cid.dest.plaintext.node_id._0_4_ = 0;
              decoded.octets.len = (size_t)(local_1a58 + (long)puVar12 * 0x10);
              do {
                *(undefined8 *)(puVar14 + -8) = 0x11a5fb;
                sVar9 = sendmsg(fd,(msghdr *)packet,0);
                if ((int)sVar9 != -1) break;
                *(undefined8 *)(puVar14 + -8) = 0x11a605;
                piVar7 = __errno_location();
              } while (*piVar7 == 4);
              puVar12 = puVar12 + 1;
            } while (puVar12 != local_50);
            bVar18 = true;
          }
        }
        else {
          bVar18 = false;
          *(undefined8 *)(puVar14 + -8) = 0x11a6b4;
          fprintf(_stderr,"quicly_send returned %d\n",(ulong)uVar4);
          local_38 = 1;
        }
        puVar14 = local_88;
        if (!bVar18) break;
        ppqVar11 = conns + lVar15;
        lVar15 = lVar15 + 1;
        bVar17 = *ppqVar11 == (quicly_conn_t *)0x0;
      } while (!bVar17);
    }
    if (!bVar17) {
      return local_38;
    }
  } while( true );
}

Assistant:

static int run_loop(int fd, quicly_conn_t *client)
{
    quicly_conn_t *conns[256] = {client}; /* a null-terminated list of connections; proper app should use a hashmap or something */
    size_t i;
    int read_stdin = client != NULL;

    while (1) {

        /* wait for sockets to become readable, or some event in the QUIC stack to fire */
        fd_set readfds;
        struct timeval tv;
        do {
            int64_t first_timeout = INT64_MAX, now = ctx.now->cb(ctx.now);
            for (i = 0; conns[i] != NULL; ++i) {
                int64_t conn_timeout = quicly_get_first_timeout(conns[i]);
                if (conn_timeout < first_timeout)
                    first_timeout = conn_timeout;
            }
            if (now < first_timeout) {
                int64_t delta = first_timeout - now;
                if (delta > 1000 * 1000)
                    delta = 1000 * 1000;
                tv.tv_sec = delta / 1000;
                tv.tv_usec = (delta % 1000) * 1000;
            } else {
                tv.tv_sec = 1000;
                tv.tv_usec = 0;
            }
            FD_ZERO(&readfds);
            FD_SET(fd, &readfds);
            /* we want to read input from stdin */
            if (read_stdin)
                FD_SET(0, &readfds);
        } while (select(fd + 1, &readfds, NULL, NULL, &tv) == -1 && errno == EINTR);

        /* read the QUIC fd */
        if (FD_ISSET(fd, &readfds)) {
            uint8_t buf[4096];
            struct sockaddr_storage sa;
            struct iovec vec = {.iov_base = buf, .iov_len = sizeof(buf)};
            struct msghdr msg = {.msg_name = &sa, .msg_namelen = sizeof(sa), .msg_iov = &vec, .msg_iovlen = 1};
            ssize_t rret;
            while ((rret = recvmsg(fd, &msg, 0)) == -1 && errno == EINTR)
                ;
            if (rret > 0)
                process_msg(client != NULL, conns, &msg, rret);
        }

        /* read stdin, send the input to the active stram */
        if (FD_ISSET(0, &readfds)) {
            assert(client != NULL);
            if (!forward_stdin(client))
                read_stdin = 0;
        }

        /* send QUIC packets, if any */
        for (i = 0; conns[i] != NULL; ++i) {
            quicly_address_t dest, src;
            struct iovec dgrams[10];
            uint8_t dgrams_buf[PTLS_ELEMENTSOF(dgrams) * ctx.transport_params.max_udp_payload_size];
            size_t num_dgrams = PTLS_ELEMENTSOF(dgrams);
            int ret = quicly_send(conns[i], &dest, &src, dgrams, &num_dgrams, dgrams_buf, sizeof(dgrams_buf));
            switch (ret) {
            case 0: {
                size_t j;
                for (j = 0; j != num_dgrams; ++j) {
                    send_one(fd, &dest.sa, &dgrams[j]);
                }
            } break;
            case QUICLY_ERROR_FREE_CONNECTION:
                /* connection has been closed, free, and exit when running as a client */
                quicly_free(conns[i]);
                memmove(conns + i, conns + i + 1, sizeof(conns) - sizeof(conns[0]) * (i + 1));
                --i;
                if (!is_server())
                    return 0;
                break;
            default:
                fprintf(stderr, "quicly_send returned %d\n", ret);
                return 1;
            }
        }
    }

    return 0;
}